

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::NullWriter::PerformPuts(NullWriter *this)

{
  pointer pNVar1;
  allocator local_b1;
  string local_b0 [36];
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  pNVar1 = std::
           unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
           ::operator->((unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
                         *)0xac8593);
  if ((pNVar1->IsOpen & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"NullWriter",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"PerformPuts",
               (allocator *)&stack0xffffffffffffff77);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,"NullWriter::PerformPuts: Engine already closed",&local_b1);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return;
}

Assistant:

void NullWriter::PerformPuts()
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullWriter", "PerformPuts",
                                          "NullWriter::PerformPuts: Engine already closed");
    }

    return;
}